

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

char * cmGetProjectName(void *arg)

{
  string local_48;
  Snapshot local_28;
  
  if (cmGetProjectName::name_abi_cxx11_ == '\0') {
    cmGetProjectName_cold_1();
  }
  cmMakefile::GetStateSnapshot((cmMakefile *)arg);
  cmState::Snapshot::GetProjectName_abi_cxx11_(&local_48,&local_28);
  std::__cxx11::string::operator=((string *)&cmGetProjectName::name_abi_cxx11_,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return cmGetProjectName::name_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* CCONV cmGetProjectName(void *arg)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  static std::string name;
  name = mf->GetStateSnapshot().GetProjectName();
  return name.c_str();
}